

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O2

REF_STATUS ref_migrate_shufflin(REF_GRID ref_grid)

{
  uint uVar1;
  int iVar2;
  REF_MPI pRVar3;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_DBL *pRVar4;
  REF_NODE ref_node_00;
  REF_GEOM ref_geom;
  REF_ADJ pRVar5;
  REF_INT *pRVar6;
  bool bVar7;
  uint uVar8;
  REF_INT *pRVar9;
  long lVar10;
  REF_INT *pRVar11;
  ulong uVar12;
  void *pvVar13;
  void *pvVar14;
  void *pvVar15;
  REF_GLOB *pRVar16;
  void *pvVar17;
  undefined4 *puVar18;
  int iVar19;
  undefined8 uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  void *pvVar24;
  ulong uVar25;
  ulong uVar26;
  char *pcVar27;
  long lVar28;
  REF_INT RVar29;
  ulong uVar30;
  bool bVar31;
  ulong uStackY_e0;
  ulong local_d0;
  ulong local_c0;
  long local_b0;
  REF_INT local_74;
  void *local_70;
  void *local_68;
  ulong local_60;
  REF_INT degree;
  REF_MPI local_50;
  int local_48 [5];
  REF_INT local_34;
  
  pRVar3 = ref_grid->mpi;
  if (pRVar3->n < 2) {
    return 0;
  }
  ref_node = ref_grid->node;
  uVar8 = ref_node_synchronize_globals(ref_node);
  if (uVar8 != 0) {
    local_d0 = (ulong)uVar8;
    pcVar27 = "sync global nodes";
    uVar20 = 0x69f;
    goto LAB_001ffc0c;
  }
  ref_mpi = ref_node->ref_mpi;
  uVar8 = ref_mpi->n;
  lVar28 = (long)(int)uVar8;
  if (lVar28 < 0) {
    pcVar27 = "malloc a_size of REF_INT negative";
    uVar20 = 0x570;
LAB_001ffb02:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
           uVar20,"ref_migrate_shufflin_node",pcVar27);
    uStackY_e0 = 1;
    local_d0 = uStackY_e0;
  }
  else {
    pRVar9 = (REF_INT *)malloc(lVar28 * 4);
    if (pRVar9 == (REF_INT *)0x0) {
      pcVar27 = "malloc a_size of REF_INT NULL";
      uVar20 = 0x570;
    }
    else {
      local_d0 = 2;
      for (lVar10 = 0; lVar28 != lVar10; lVar10 = lVar10 + 1) {
        pRVar9[lVar10] = 0;
      }
      local_50 = pRVar3;
      pRVar11 = (REF_INT *)malloc(lVar28 * 4);
      if (pRVar11 == (REF_INT *)0x0) {
        pcVar27 = "malloc b_size of REF_INT NULL";
        uVar20 = 0x571;
      }
      else {
        for (lVar10 = 0; lVar28 != lVar10; lVar10 = lVar10 + 1) {
          pRVar11[lVar10] = 0;
        }
        uVar21 = 0;
        uVar12 = (ulong)(uint)ref_node->max;
        if (ref_node->max < 1) {
          uVar12 = uVar21;
        }
        for (; uVar12 != uVar21; uVar21 = uVar21 + 1) {
          if (-1 < ref_node->global[uVar21]) {
            uVar22 = ref_node->part[uVar21];
            if (ref_mpi->id != uVar22) {
              if (uVar8 <= uVar22) {
                printf("id %d node %d global %ld part %d ");
                pcVar27 = "part out of range";
                uVar20 = 0x57a;
                goto LAB_001ffb02;
              }
              pRVar9[uVar22] = pRVar9[uVar22] + 1;
            }
          }
        }
        uVar8 = ref_mpi_alltoall(ref_mpi,pRVar9,pRVar11,1);
        if (uVar8 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x581,"ref_migrate_shufflin_node",(ulong)uVar8,"alltoall sizes");
          local_d0 = (ulong)uVar8;
          goto LAB_001ffbeb;
        }
        uVar8 = ref_mpi->n;
        uVar12 = 0;
        uVar21 = 0;
        if (0 < (int)uVar8) {
          uVar21 = (ulong)uVar8;
        }
        uVar22 = 0;
        for (; uVar21 != uVar12; uVar12 = uVar12 + 1) {
          uVar22 = uVar22 + pRVar9[uVar12];
        }
        if ((int)uVar22 < 0) {
          pcVar27 = "malloc a_global of REF_GLOB negative";
          uVar20 = 0x585;
LAB_001ffd32:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,uVar20,"ref_migrate_shufflin_node",pcVar27);
          local_d0 = 1;
          goto LAB_001ffbeb;
        }
        pvVar13 = malloc((ulong)uVar22 << 3);
        if (pvVar13 == (void *)0x0) {
          pcVar27 = "malloc a_global of REF_GLOB NULL";
          uVar20 = 0x585;
        }
        else {
          pvVar14 = malloc((ulong)(uVar22 * 0xf) << 3);
          if (pvVar14 == (void *)0x0) {
            pcVar27 = "malloc a_real of REF_DBL NULL";
            uVar20 = 0x586;
          }
          else {
            uVar1 = ref_node->naux;
            if ((long)(int)uVar1 < 1) {
              pvVar15 = (void *)0x0;
            }
            else {
              pvVar15 = malloc((ulong)(uVar22 * uVar1) << 3);
              if (pvVar15 == (void *)0x0) {
                pcVar27 = "malloc a_aux of REF_DBL NULL";
                uVar20 = 0x589;
                goto LAB_001ffbe0;
              }
            }
            uVar25 = 0;
            for (uVar12 = 0; iVar23 = (int)uVar25, uVar21 != uVar12; uVar12 = uVar12 + 1) {
              uVar25 = (ulong)(uint)(iVar23 + pRVar11[uVar12]);
            }
            if (iVar23 < 0) {
              pcVar27 = "malloc b_global of REF_GLOB negative";
              uVar20 = 0x58d;
              goto LAB_001ffd32;
            }
            local_60 = uVar25;
            pRVar16 = (REF_GLOB *)malloc(uVar25 * 8);
            if (pRVar16 == (REF_GLOB *)0x0) {
              pcVar27 = "malloc b_global of REF_GLOB NULL";
              uVar20 = 0x58d;
            }
            else {
              pvVar17 = malloc((ulong)(uint)(iVar23 * 0xf) << 3);
              if (pvVar17 != (void *)0x0) {
                local_68 = pvVar17;
                if ((int)uVar1 < 1) {
                  pvVar17 = (void *)0x0;
                }
                else {
                  pvVar17 = malloc((ulong)(iVar23 * uVar1) << 3);
                  if (pvVar17 == (void *)0x0) {
                    pcVar27 = "malloc b_aux of REF_DBL NULL";
                    uVar20 = 0x591;
                    goto LAB_001ffbe0;
                  }
                }
                if ((int)uVar8 < 0) {
                  pcVar27 = "malloc a_next of REF_INT negative";
                  uVar20 = 0x593;
                  goto LAB_001ffd32;
                }
                local_70 = pvVar17;
                puVar18 = (undefined4 *)malloc((ulong)uVar8 * 4);
                if (puVar18 == (undefined4 *)0x0) {
                  pcVar27 = "malloc a_next of REF_INT NULL";
                  uVar20 = 0x593;
                  goto LAB_001ffbe0;
                }
                *puVar18 = 0;
                iVar19 = 0;
                for (uVar12 = 1; uVar12 < uVar8; uVar12 = uVar12 + 1) {
                  iVar19 = iVar19 + pRVar9[uVar12 - 1];
                  puVar18[uVar12] = iVar19;
                }
                uVar21 = 0;
                uVar12 = 0;
                if (0 < (int)uVar1) {
                  uVar12 = (ulong)uVar1;
                }
                uVar25 = (ulong)(uint)ref_node->max;
                if (ref_node->max < 1) {
                  uVar25 = uVar21;
                }
                lVar28 = 0;
                for (uVar26 = 0; uVar26 != uVar25; uVar26 = uVar26 + 1) {
                  if ((-1 < ref_node->global[uVar26]) &&
                     (iVar19 = ref_node->part[uVar26], ref_mpi->id != iVar19)) {
                    iVar2 = puVar18[iVar19];
                    *(REF_GLOB *)((long)pvVar13 + (long)iVar2 * 8) = ref_node->global[uVar26];
                    pRVar4 = ref_node->real;
                    for (lVar10 = 0; lVar10 != 0xf; lVar10 = lVar10 + 1) {
                      *(undefined8 *)((long)pvVar14 + lVar10 * 8 + (long)(iVar2 * 0xf) * 8) =
                           *(undefined8 *)((long)pRVar4 + lVar10 * 8 + lVar28);
                    }
                    for (uVar30 = 0; uVar12 != uVar30; uVar30 = uVar30 + 1) {
                      *(undefined8 *)((long)pvVar15 + uVar30 * 8 + (long)(int)(iVar2 * uVar1) * 8) =
                           *(undefined8 *)((long)ref_node->aux + uVar30 * 8 + uVar21);
                    }
                    puVar18[iVar19] = iVar2 + 1;
                  }
                  lVar28 = lVar28 + 0x78;
                  uVar21 = uVar21 + (long)(int)uVar1 * 8;
                }
                uVar8 = ref_mpi_alltoallv(ref_mpi,pvVar13,pRVar9,pRVar16,pRVar11,1,2);
                if (uVar8 == 0) {
                  uVar8 = ref_mpi_alltoallv(ref_mpi,pvVar14,pRVar9,local_68,pRVar11,0xf,3);
                  if (uVar8 == 0) {
                    if ((ref_node->naux < 1) ||
                       (uVar8 = ref_mpi_alltoallv(ref_mpi,pvVar15,pRVar9,local_70,pRVar11,
                                                  ref_node->naux,3), uVar8 == 0)) {
                      uVar8 = ref_node_add_many(ref_node,iVar23,pRVar16);
                      if (uVar8 == 0) {
                        local_b0 = 0;
                        pvVar17 = local_68;
                        for (uVar12 = 0; uVar12 != local_60; uVar12 = uVar12 + 1) {
                          uVar8 = ref_node_local(ref_node,pRVar16[uVar12],local_48);
                          if (uVar8 != 0) {
                            local_d0 = (ulong)uVar8;
                            pcVar27 = "local";
                            uVar20 = 0x5b6;
                            goto LAB_002000d9;
                          }
                          pRVar4 = ref_node->real;
                          for (lVar28 = 0; lVar28 != 0xf; lVar28 = lVar28 + 1) {
                            pRVar4[local_48[0] * 0xf + lVar28] =
                                 *(REF_DBL *)((long)pvVar17 + lVar28 * 8);
                          }
                          uVar8 = ref_node->naux;
                          uVar21 = 0;
                          if (0 < (int)uVar8) {
                            uVar21 = (ulong)uVar8;
                          }
                          for (uVar25 = 0; uVar21 != uVar25; uVar25 = uVar25 + 1) {
                            ref_node->aux[(long)(int)(uVar8 * local_48[0]) + uVar25] =
                                 *(REF_DBL *)((long)local_70 + uVar25 * 8 + (int)uVar8 * local_b0);
                          }
                          ref_node->part[local_48[0]] = ref_mpi->id;
                          pvVar17 = (void *)((long)pvVar17 + 0x78);
                          local_b0 = local_b0 + 8;
                        }
                        free(puVar18);
                        free(local_70);
                        free(local_68);
                        free(pRVar16);
                        free(pvVar15);
                        free(pvVar14);
                        free(pvVar13);
                        free(pRVar11);
                        free(pRVar9);
                        pRVar3 = ref_grid->mpi;
                        lVar28 = (long)pRVar3->n;
                        if (lVar28 < 2) {
LAB_00200a69:
                          for (lVar28 = 2; lVar28 != 0x12; lVar28 = lVar28 + 1) {
                            uVar8 = ref_migrate_shufflin_cell(ref_node,ref_grid->cell[lVar28 + -2]);
                            if (uVar8 != 0) {
                              local_d0 = (ulong)uVar8;
                              pcVar27 = "cell";
                              uVar20 = 0x6a4;
                              goto LAB_001ffc0c;
                            }
                          }
                          for (lVar28 = 0; lVar28 < ref_node->max; lVar28 = lVar28 + 1) {
                            if (-1 < ref_node->global[lVar28]) {
                              RVar29 = (REF_INT)lVar28;
                              if (local_50->id == ref_node->part[lVar28]) {
                                uVar8 = ref_geom_remove_without_cell(ref_grid,RVar29);
                                if (uVar8 != 0) {
                                  local_d0 = (ulong)uVar8;
                                  pcVar27 = "rm local geom without cell support";
                                  uVar20 = 0x6ba;
                                  goto LAB_001ffc0c;
                                }
                              }
                              else {
                                bVar31 = false;
                                for (lVar10 = 2; lVar10 != 0x12; lVar10 = lVar10 + 1) {
                                  bVar7 = !bVar31;
                                  bVar31 = true;
                                  if (bVar7) {
                                    pRVar5 = ref_grid->cell[lVar10 + -2]->ref_adj;
                                    bVar31 = false;
                                    if (lVar28 < pRVar5->nnode) {
                                      bVar31 = pRVar5->first[lVar28] != -1;
                                    }
                                  }
                                }
                                if (bVar31) {
                                  uVar8 = ref_geom_remove_without_cell(ref_grid,RVar29);
                                  if (uVar8 != 0) {
                                    local_d0 = (ulong)uVar8;
                                    pcVar27 = "rm ghost geom without cell support";
                                    uVar20 = 0x6b0;
                                    goto LAB_001ffc0c;
                                  }
                                }
                                else {
                                  uVar8 = ref_node_remove_without_global_invalidates_sorted
                                                    (ref_node,RVar29);
                                  if (uVar8 != 0) {
                                    local_d0 = (ulong)uVar8;
                                    pcVar27 = "remove";
                                    uVar20 = 0x6b3;
                                    goto LAB_001ffc0c;
                                  }
                                  uVar8 = ref_geom_remove_all(ref_grid->geom,RVar29);
                                  if (uVar8 != 0) {
                                    local_d0 = (ulong)uVar8;
                                    pcVar27 = "rm geom";
                                    uVar20 = 0x6b4;
                                    goto LAB_001ffc0c;
                                  }
                                }
                              }
                            }
                          }
                          uVar8 = ref_node_rebuild_sorted_global(ref_node);
                          if (uVar8 == 0) {
                            uVar8 = ref_node_ghost_real(ref_node);
                            if (uVar8 == 0) {
                              uVar8 = ref_geom_ghost(ref_grid->geom,ref_node);
                              if (uVar8 == 0) {
                                return 0;
                              }
                              local_d0 = (ulong)uVar8;
                              pcVar27 = "ghost geom";
                              uVar20 = 0x6c0;
                            }
                            else {
                              local_d0 = (ulong)uVar8;
                              pcVar27 = "ghost real";
                              uVar20 = 0x6bf;
                            }
                          }
                          else {
                            local_d0 = (ulong)uVar8;
                            pcVar27 = "rebuild";
                            uVar20 = 0x6bd;
                          }
                          goto LAB_001ffc0c;
                        }
                        ref_node_00 = ref_grid->node;
                        ref_geom = ref_grid->geom;
                        pRVar5 = ref_geom->ref_adj;
                        pRVar9 = (REF_INT *)malloc(lVar28 * 4);
                        if (pRVar9 == (REF_INT *)0x0) {
                          pcVar27 = "malloc a_size of REF_INT NULL";
                          uVar20 = 0x64b;
LAB_00200449:
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                 ,uVar20,"ref_migrate_shufflin_geom",pcVar27);
                        }
                        else {
                          for (lVar10 = 0; lVar28 != lVar10; lVar10 = lVar10 + 1) {
                            pRVar9[lVar10] = 0;
                          }
                          pRVar11 = (REF_INT *)malloc(lVar28 * 4);
                          if (pRVar11 == (REF_INT *)0x0) {
                            pcVar27 = "malloc b_size of REF_INT NULL";
                            uVar20 = 0x64c;
                            goto LAB_00200449;
                          }
                          for (lVar10 = 0; lVar28 != lVar10; lVar10 = lVar10 + 1) {
                            pRVar11[lVar10] = 0;
                          }
                          for (lVar28 = 0; lVar28 < ref_node_00->max; lVar28 = lVar28 + 1) {
                            if ((-1 < ref_node_00->global[lVar28]) &&
                               (pRVar3->id != ref_node_00->part[lVar28])) {
                              uVar8 = ref_adj_degree(pRVar5,(REF_INT)lVar28,&degree);
                              if (uVar8 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                       ,0x650,"ref_migrate_shufflin_geom",(ulong)uVar8,"adj deg");
                                local_d0 = (ulong)uVar8;
                                goto LAB_00200450;
                              }
                              pRVar9[ref_node_00->part[lVar28]] =
                                   pRVar9[ref_node_00->part[lVar28]] + degree;
                            }
                          }
                          uVar8 = ref_mpi_alltoall(pRVar3,pRVar9,pRVar11,1);
                          if (uVar8 == 0) {
                            uVar8 = pRVar3->n;
                            uVar12 = 0;
                            uVar21 = 0;
                            if (0 < (int)uVar8) {
                              uVar21 = (ulong)uVar8;
                            }
                            iVar23 = 0;
                            for (; uVar21 != uVar12; uVar12 = uVar12 + 1) {
                              iVar23 = iVar23 + pRVar9[uVar12];
                            }
                            if (-1 < iVar23) {
                              pvVar13 = malloc((ulong)(uint)(iVar23 * 6) << 3);
                              if (pvVar13 == (void *)0x0) {
                                pcVar27 = "malloc a_int of REF_GLOB NULL";
                                uVar20 = 0x65a;
                              }
                              else {
                                pvVar14 = malloc((ulong)(uint)(iVar23 * 2) << 3);
                                if (pvVar14 == (void *)0x0) {
                                  pcVar27 = "malloc a_real of REF_DBL NULL";
                                  uVar20 = 0x65b;
                                }
                                else {
                                  uVar22 = 0;
                                  for (uVar12 = 0; uVar21 != uVar12; uVar12 = uVar12 + 1) {
                                    uVar22 = uVar22 + pRVar11[uVar12];
                                  }
                                  if ((int)uVar22 < 0) {
                                    pcVar27 = "malloc b_int of REF_GLOB negative";
                                    uVar20 = 0x65f;
                                    goto LAB_0020054e;
                                  }
                                  pvVar15 = malloc((ulong)(uVar22 * 6) << 3);
                                  if (pvVar15 == (void *)0x0) {
                                    pcVar27 = "malloc b_int of REF_GLOB NULL";
                                    uVar20 = 0x65f;
                                  }
                                  else {
                                    pvVar17 = malloc((ulong)(uVar22 * 2) << 3);
                                    if (pvVar17 == (void *)0x0) {
                                      pcVar27 = "malloc b_real of REF_DBL NULL";
                                      uVar20 = 0x660;
                                    }
                                    else {
                                      if ((int)uVar8 < 0) {
                                        pcVar27 = "malloc a_next of REF_INT negative";
                                        uVar20 = 0x662;
                                        goto LAB_0020054e;
                                      }
                                      puVar18 = (undefined4 *)malloc((ulong)uVar8 * 4);
                                      if (puVar18 != (undefined4 *)0x0) {
                                        *puVar18 = 0;
                                        iVar23 = 0;
                                        for (uVar12 = 1; uVar12 < uVar8; uVar12 = uVar12 + 1) {
                                          iVar23 = iVar23 + pRVar9[uVar12 - 1];
                                          puVar18[uVar12] = iVar23;
                                        }
                                        uVar8 = ref_node_00->max;
                                        local_c0 = 0;
                                        local_60 = 0;
                                        if (0 < (int)uVar8) {
                                          local_60 = (ulong)uVar8;
                                        }
                                        for (; local_74 = (REF_INT)local_c0, local_c0 != local_60;
                                            local_c0 = local_c0 + 1) {
                                          pRVar16 = ref_node_00->global;
                                          if ((-1 < pRVar16[local_c0]) &&
                                             (iVar23 = ref_node_00->part[local_c0],
                                             pRVar3->id != iVar23)) {
                                            uVar12 = 0xffffffff;
                                            RVar29 = -1;
                                            if ((long)local_c0 < (long)pRVar5->nnode) {
                                              uVar1 = pRVar5->first[local_c0];
                                              uVar12 = 0xffffffff;
                                              RVar29 = -1;
                                              if ((long)(int)uVar1 != -1) {
                                                RVar29 = pRVar5->item[(int)uVar1].ref;
                                                uVar12 = (ulong)uVar1;
                                              }
                                            }
                                            while ((int)uVar12 != -1) {
                                              iVar19 = puVar18[iVar23];
                                              pRVar6 = ref_geom->descr;
                                              for (lVar28 = 0; lVar28 != 6; lVar28 = lVar28 + 1) {
                                                *(long *)((long)pvVar13 +
                                                         lVar28 * 8 + (long)(iVar19 * 6) * 8) =
                                                     (long)pRVar6[RVar29 * 6 + lVar28];
                                              }
                                              uVar1 = pRVar6[(long)(RVar29 * 6) + 5];
                                              lVar28 = -1;
                                              if ((int)uVar1 < (int)uVar8 && -1 < (int)uVar1) {
                                                lVar28 = pRVar16[uVar1];
                                                if (lVar28 < 0) {
                                                  lVar28 = -1;
                                                }
                                              }
                                              *(long *)((long)pvVar13 +
                                                       (long)(iVar19 * 6) * 8 + 0x28) = lVar28;
                                              pRVar4 = ref_geom->param;
                                              *(REF_DBL *)((long)pvVar14 + (long)iVar19 * 0x10) =
                                                   pRVar4[RVar29 * 2];
                                              *(REF_DBL *)
                                               ((long)pvVar14 + (long)(iVar19 * 2 + 1) * 8) =
                                                   pRVar4[RVar29 * 2 + 1];
                                              puVar18[iVar23] = iVar19 + 1;
                                              uVar12 = (ulong)pRVar5->item[(int)uVar12].next;
                                              RVar29 = -1;
                                              if (uVar12 != 0xffffffffffffffff) {
                                                RVar29 = pRVar5->item[uVar12].ref;
                                              }
                                            }
                                          }
                                        }
                                        uVar8 = ref_mpi_alltoallv(pRVar3,pvVar13,pRVar9,pvVar15,
                                                                  pRVar11,6,2);
                                        local_d0 = (ulong)uVar8;
                                        if (uVar8 == 0) {
                                          uVar8 = ref_mpi_alltoallv(pRVar3,pvVar14,pRVar9,pvVar17,
                                                                    pRVar11,2,3);
                                          local_d0 = (ulong)uVar8;
                                          if (uVar8 == 0) {
                                            uVar12 = 0;
                                            pvVar24 = pvVar15;
                                            do {
                                              if (uVar12 == uVar22) {
                                                free(puVar18);
                                                free(pvVar17);
                                                free(pvVar15);
                                                free(pvVar14);
                                                free(pvVar13);
                                                free(pRVar11);
                                                free(pRVar9);
                                                goto LAB_00200a69;
                                              }
                                              for (lVar28 = 0; lVar28 != 6; lVar28 = lVar28 + 1) {
                                                local_48[lVar28] =
                                                     *(int *)((long)pvVar24 + lVar28 * 8);
                                              }
                                              uVar8 = ref_node_local(ref_node_00,
                                                                     *(REF_GLOB *)
                                                                      ((long)pvVar15 +
                                                                      uVar12 * 0x30 + 0x28),
                                                                     &local_74);
                                              local_d0 = (ulong)uVar8;
                                              if (uVar8 != 0) {
                                                pcVar27 = "g2l";
                                                uVar20 = 0x685;
                                                goto LAB_0020095c;
                                              }
                                              local_34 = local_74;
                                              uVar8 = ref_geom_add_with_descr
                                                                (ref_geom,local_48,
                                                                 (REF_DBL *)
                                                                 (uVar12 * 0x10 + (long)pvVar17));
                                              uVar12 = uVar12 + 1;
                                              pvVar24 = (void *)((long)pvVar24 + 0x30);
                                              local_d0 = (ulong)uVar8;
                                            } while (uVar8 == 0);
                                            pcVar27 = "geom add";
                                            uVar20 = 0x688;
                                          }
                                          else {
                                            pcVar27 = "alltoallv geom real";
                                            uVar20 = 0x67e;
                                          }
                                        }
                                        else {
                                          pcVar27 = "alltoallv geom int";
                                          uVar20 = 0x67b;
                                        }
LAB_0020095c:
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                               ,uVar20,"ref_migrate_shufflin_geom",local_d0,pcVar27)
                                        ;
                                        goto LAB_00200450;
                                      }
                                      pcVar27 = "malloc a_next of REF_INT NULL";
                                      uVar20 = 0x662;
                                    }
                                  }
                                }
                              }
                              goto LAB_00200449;
                            }
                            pcVar27 = "malloc a_int of REF_GLOB negative";
                            uVar20 = 0x65a;
LAB_0020054e:
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                   ,uVar20,"ref_migrate_shufflin_geom",pcVar27);
                            local_d0 = 1;
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                   ,0x656,"ref_migrate_shufflin_geom",(ulong)uVar8,"alltoall sizes")
                            ;
                            local_d0 = (ulong)uVar8;
                          }
                        }
LAB_00200450:
                        pcVar27 = "geom";
                        uVar20 = 0x6a2;
                        goto LAB_001ffc0c;
                      }
                      local_d0 = (ulong)uVar8;
                      pcVar27 = "add many";
                      uVar20 = 0x5b3;
                    }
                    else {
                      local_d0 = (ulong)uVar8;
                      pcVar27 = "alltoallv aux";
                      uVar20 = 0x5b1;
                    }
                  }
                  else {
                    local_d0 = (ulong)uVar8;
                    pcVar27 = "alltoallv real";
                    uVar20 = 0x5ac;
                  }
                }
                else {
                  local_d0 = (ulong)uVar8;
                  pcVar27 = "alltoallv global";
                  uVar20 = 0x5a8;
                }
LAB_002000d9:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,uVar20,"ref_migrate_shufflin_node",local_d0,pcVar27);
                goto LAB_001ffbeb;
              }
              pcVar27 = "malloc b_real of REF_DBL NULL";
              uVar20 = 0x58e;
            }
          }
        }
      }
    }
LAB_001ffbe0:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
           uVar20,"ref_migrate_shufflin_node",pcVar27);
    uStackY_e0 = 2;
    local_d0 = uStackY_e0;
  }
LAB_001ffbeb:
  pcVar27 = "send out nodes";
  uVar20 = 0x6a1;
LAB_001ffc0c:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar20,
         "ref_migrate_shufflin",local_d0,pcVar27);
  return (REF_STATUS)local_d0;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_shufflin(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT group, node;
  REF_BOOL need_to_keep;

  if (!ref_mpi_para(ref_grid_mpi(ref_grid))) return REF_SUCCESS;

  RSS(ref_node_synchronize_globals(ref_node), "sync global nodes");

  RSS(ref_migrate_shufflin_node(ref_node), "send out nodes");
  RSS(ref_migrate_shufflin_geom(ref_grid), "geom");
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_migrate_shufflin_cell(ref_node, ref_cell), "cell");
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      need_to_keep = REF_FALSE;
      each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
        need_to_keep =
            (need_to_keep || !ref_adj_empty(ref_cell_adj(ref_cell), node));
      }
      if (need_to_keep) {
        RSS(ref_geom_remove_without_cell(ref_grid, node),
            "rm ghost geom without cell support");
      } else {
        RSS(ref_node_remove_without_global_invalidates_sorted(ref_node, node),
            "remove");
        RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), node), "rm geom");
      }
    } else {
      /* not sure why this is needed,
       * geom on a ghost that was removed from local? */
      RSS(ref_geom_remove_without_cell(ref_grid, node),
          "rm local geom without cell support");
    }
  }
  RSS(ref_node_rebuild_sorted_global(ref_node), "rebuild");

  RSS(ref_node_ghost_real(ref_node), "ghost real");
  RSS(ref_geom_ghost(ref_grid_geom(ref_grid), ref_node), "ghost geom");

  return REF_SUCCESS;
}